

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevectorhash.cpp
# Opt level: O2

void __thiscall ByteVectorHash::ByteVectorHash(ByteVectorHash *this)

{
  uint64_t uVar1;
  long in_FS_OFFSET;
  FastRandomContext local_a0;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&local_a0,false);
  uVar1 = FastRandomContext::rand64(&local_a0);
  ChaCha20::~ChaCha20(&local_a0.rng);
  this->m_k0 = uVar1;
  FastRandomContext::FastRandomContext(&local_a0,false);
  uVar1 = FastRandomContext::rand64(&local_a0);
  ChaCha20::~ChaCha20(&local_a0.rng);
  this->m_k1 = uVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ByteVectorHash::ByteVectorHash() :
    m_k0(FastRandomContext().rand64()),
    m_k1(FastRandomContext().rand64())
{
}